

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::reserve
          (stack<c4::yml::Parser::State,_16UL> *this,size_t sz)

{
  State *__dest;
  
  if (this->m_size < sz) {
    if (sz < 0x11) {
      this->m_stack = this->m_buf;
      sz = 0x10;
    }
    else {
      __dest = (State *)(*(this->m_callbacks).m_allocate)
                                  (sz * 0x98,this->m_stack,(this->m_callbacks).m_user_data);
      memcpy(__dest,this->m_stack,this->m_size * 0x98);
      if ((stack<c4::yml::Parser::State,_16UL> *)this->m_stack != this) {
        (*(this->m_callbacks).m_free)
                  ((stack<c4::yml::Parser::State,_16UL> *)this->m_stack,this->m_capacity * 0x98,
                   (this->m_callbacks).m_user_data);
      }
      this->m_stack = __dest;
    }
    this->m_capacity = sz;
  }
  return;
}

Assistant:

void stack<T, N>::reserve(size_t sz)
{
    if(sz <= m_size)
        return;
    if(sz <= N)
    {
        m_stack = m_buf;
        m_capacity = N;
        return;
    }
    T *buf = (T*) m_callbacks.m_allocate(sz * sizeof(T), m_stack, m_callbacks.m_user_data);
    memcpy(buf, m_stack, m_size * sizeof(T));
    if(m_stack != m_buf)
    {
        m_callbacks.m_free(m_stack, m_capacity * sizeof(T), m_callbacks.m_user_data);
    }
    m_stack = buf;
    m_capacity = sz;
}